

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<unsigned_char> * __thiscall
kj::Array<unsigned_char>::releaseAsBytes
          (Array<unsigned_char> *__return_storage_ptr__,Array<unsigned_char> *this)

{
  Array<unsigned_char> *this_local;
  Array<unsigned_char> *result;
  
  if (this->disposer == (ArrayDisposer *)0x0) {
    Array(__return_storage_ptr__,(void *)0x0);
  }
  else {
    Array(__return_storage_ptr__,this->ptr,this->size_,this->disposer);
    this->ptr = (uchar *)0x0;
    this->size_ = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Array<PropagateConst<T, byte>> releaseAsBytes() {
    // Like asBytes() but transfers ownership.
    static_assert(sizeof(T) == sizeof(byte),
        "releaseAsBytes() only possible on arrays with byte-size elements (e.g. chars).");
    if (disposer == nullptr) return nullptr;
    Array<PropagateConst<T, byte>> result(
        reinterpret_cast<PropagateConst<T, byte>*>(ptr), size_, *disposer);
    ptr = nullptr;
    size_ = 0;
    return result;
  }